

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall ast::Add::Add(Add *this,Token *t,int line)

{
  Token local_50;
  int local_1c;
  Token *pTStack_18;
  int line_local;
  Token *t_local;
  Add *this_local;
  
  local_1c = line;
  pTStack_18 = t;
  t_local = (Token *)this;
  token::Token::Token(&local_50,t);
  BinaryOp::BinaryOp(&this->super_BinaryOp,&local_50,2,0,local_1c);
  token::Token::~Token(&local_50);
  (this->super_BinaryOp).super_Op.super_Expr.super_Node._vptr_Node =
       (_func_int **)&PTR__Add_001e0fa0;
  return;
}

Assistant:

Add(Token t, int line)
        :BinaryOp(t, PRECENDENCE::ADD, ASSOCIATION::LEFT,line){}